

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O3

void ritual_four(CHAR_DATA *ch,CHAR_DATA *victim)

{
  byte *pbVar1;
  bool bVar2;
  int idam;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  AFFECT_DATA local_90;
  
  if (ch->disrupted == false) {
    if (ch->fighting == (CHAR_DATA *)0x0) {
      act("$n points at $N and the rotting body crumbles to ashes!",ch,(void *)0x0,victim,0);
      act("You point at $N and the rotting body crumbles to ashes!",ch,(void *)0x0,victim,3);
      number_range(0xb7c,0xb7e);
      pMobIndex = get_mob_index(0);
      ch_00 = create_mobile(pMobIndex);
      char_to_room(ch_00,ch->in_room);
      ch_00->hit = victim->hit;
      ch_00->max_hit = victim->max_hit;
      ch_00->level = victim->level;
      bVar2 = is_affected(victim,(int)gsn_unholy_bond);
      if (bVar2) {
        init_affect(&local_90);
        local_90.where = 0;
        local_90.type = gsn_unholy_bond;
        local_90.aftype = 1;
        local_90.duration = -1;
        affect_to_char(ch_00,&local_90);
      }
      extract_char(victim,true);
      act("From the ashes rises $n!",ch_00,(void *)0x0,ch,4);
      add_follower(ch_00,ch);
      ch_00->leader = ch;
      pbVar1 = (byte *)((long)ch_00->affected_by + 2);
      *pbVar1 = *pbVar1 | 4;
      init_affect(&local_90);
    }
    else {
      send_to_char("The Dark Gods are angered at the disruption, and unleash their fury upon you!\n\r"
                   ,ch);
      act("A swirling black cloud coalesces above and lashes out at $n!",ch,(void *)0x0,(void *)0x0,
          0);
      idam = dice(0x12,0x12);
      damage_new(ch,ch,idam,(int)gsn_unholy_bond,9,true,false,0,1,"a nether bolt*");
    }
  }
  return;
}

Assistant:

void ritual_four(CHAR_DATA *ch, CHAR_DATA *victim)
{

	CHAR_DATA *mob;
	AFFECT_DATA af;

	if (ch->disrupted)
		return;

	if (ch->fighting)
	{
		send_to_char("The Dark Gods are angered at the disruption, and unleash their fury upon you!\n\r", ch);
		act("A swirling black cloud coalesces above and lashes out at $n!", ch, nullptr, nullptr, TO_ROOM);
		damage_new(ch, ch, dice(18, 18), gsn_unholy_bond, DAM_NEGATIVE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "a nether bolt*");
		return;
	}

	act("$n points at $N and the rotting body crumbles to ashes!", ch, 0, victim, TO_ROOM);
	act("You point at $N and the rotting body crumbles to ashes!", ch, 0, victim, TO_CHAR);

	mob = create_mobile(get_mob_index(number_range(2940, 2942)));

	char_to_room(mob, ch->in_room);

	mob->hit = victim->hit;
	mob->max_hit = victim->max_hit;
	mob->level = victim->level;

	if (is_affected(victim, gsn_unholy_bond))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_unholy_bond;
		af.aftype = AFT_SKILL;
		af.duration = -1;
		affect_to_char(mob, &af);
	}

	extract_char(victim, true);

	act("From the ashes rises $n!", mob, 0, ch, TO_ALL);

	add_follower(mob, ch);

	mob->leader = ch;

	SET_BIT(mob->affected_by, AFF_CHARM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_unholy_bond;
	af.aftype = AFT_SKILL;
	af.duration = -1;
	//TODO: no affect_to_char or similar
}